

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.c
# Opt level: O0

void BrotliStoreMetaBlockTrivial
               (MemoryManager *m,uint8_t *input,size_t start_pos,size_t length,size_t mask,
               int is_last,BrotliEncoderParams *params,Command_conflict *commands,size_t n_commands,
               size_t *storage_ix,uint8_t *storage)

{
  uint uVar1;
  HuffmanTree *tree_00;
  uint32_t num_distance_symbols;
  HuffmanTree *tree;
  uint16_t dist_bits [140];
  uint8_t local_2438 [8];
  uint8_t dist_depth [140];
  uint16_t cmd_bits [704];
  uint8_t cmd_depth [704];
  uint16_t lit_bits [256];
  uint8_t lit_depth [256];
  undefined1 local_1860 [8];
  HistogramDistance dist_histo;
  HistogramCommand cmd_histo;
  HistogramLiteral lit_histo;
  int is_last_local;
  size_t mask_local;
  size_t length_local;
  size_t start_pos_local;
  uint8_t *input_local;
  MemoryManager *m_local;
  uint64_t v;
  uint8_t *p;
  
  uVar1 = (params->dist).alphabet_size;
  StoreCompressedMetaBlockHeader(is_last,length,storage_ix,storage);
  memset(&cmd_histo.bit_cost_,0,0x400);
  memset(&dist_histo.bit_cost_,0,0xb00);
  cmd_histo.data_[0x2be] = 0;
  cmd_histo.data_[0x2bf] = 0;
  cmd_histo.total_count_ = 0x7ff0000000000000;
  memset(local_1860,0,0x880);
  dist_histo.data_[0x21e] = 0;
  dist_histo.data_[0x21f] = 0;
  dist_histo.total_count_ = 0x7ff0000000000000;
  BuildHistograms(input,start_pos,mask,commands,n_commands,(HistogramLiteral *)&cmd_histo.bit_cost_,
                  (HistogramCommand *)&dist_histo.bit_cost_,(HistogramDistance *)local_1860);
  *(ulong *)(storage + (*storage_ix >> 3)) =
       0L << ((byte)*storage_ix & 7) | (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
  *storage_ix = *storage_ix + 0xd;
  tree_00 = (HuffmanTree *)BrotliAllocate(m,0x2c08);
  BuildAndStoreHuffmanTree
            ((uint32_t *)&cmd_histo.bit_cost_,0x100,0x100,tree_00,(uint8_t *)(lit_bits + 0xfc),
             (uint16_t *)(cmd_depth + 0x2b8),storage_ix,storage);
  BuildAndStoreHuffmanTree
            ((uint32_t *)&dist_histo.bit_cost_,0x2c0,0x2c0,tree_00,(uint8_t *)(cmd_bits + 700),
             (uint16_t *)(dist_depth + 0x88),storage_ix,storage);
  BuildAndStoreHuffmanTree
            ((uint32_t *)local_1860,0x8c,(ulong)uVar1,tree_00,local_2438,(uint16_t *)&tree,
             storage_ix,storage);
  BrotliFree(m,tree_00);
  StoreDataWithHuffmanCodes
            (input,start_pos,mask,commands,n_commands,(uint8_t *)(lit_bits + 0xfc),
             (uint16_t *)(cmd_depth + 0x2b8),(uint8_t *)(cmd_bits + 700),
             (uint16_t *)(dist_depth + 0x88),local_2438,(uint16_t *)&tree,storage_ix,storage);
  if (is_last != 0) {
    JumpToByteBoundary(storage_ix,storage);
  }
  return;
}

Assistant:

void BrotliStoreMetaBlockTrivial(MemoryManager* m,
    const uint8_t* input, size_t start_pos, size_t length, size_t mask,
    BROTLI_BOOL is_last, const BrotliEncoderParams* params,
    const Command* commands, size_t n_commands,
    size_t* storage_ix, uint8_t* storage) {
  HistogramLiteral lit_histo;
  HistogramCommand cmd_histo;
  HistogramDistance dist_histo;
  uint8_t lit_depth[BROTLI_NUM_LITERAL_SYMBOLS];
  uint16_t lit_bits[BROTLI_NUM_LITERAL_SYMBOLS];
  uint8_t cmd_depth[BROTLI_NUM_COMMAND_SYMBOLS];
  uint16_t cmd_bits[BROTLI_NUM_COMMAND_SYMBOLS];
  uint8_t dist_depth[MAX_SIMPLE_DISTANCE_ALPHABET_SIZE];
  uint16_t dist_bits[MAX_SIMPLE_DISTANCE_ALPHABET_SIZE];
  HuffmanTree* tree;
  uint32_t num_distance_symbols = params->dist.alphabet_size;

  StoreCompressedMetaBlockHeader(is_last, length, storage_ix, storage);

  HistogramClearLiteral(&lit_histo);
  HistogramClearCommand(&cmd_histo);
  HistogramClearDistance(&dist_histo);

  BuildHistograms(input, start_pos, mask, commands, n_commands,
                  &lit_histo, &cmd_histo, &dist_histo);

  BrotliWriteBits(13, 0, storage_ix, storage);

  tree = BROTLI_ALLOC(m, HuffmanTree, MAX_HUFFMAN_TREE_SIZE);
  if (BROTLI_IS_OOM(m)) return;
  BuildAndStoreHuffmanTree(lit_histo.data_, BROTLI_NUM_LITERAL_SYMBOLS,
                           BROTLI_NUM_LITERAL_SYMBOLS, tree,
                           lit_depth, lit_bits,
                           storage_ix, storage);
  BuildAndStoreHuffmanTree(cmd_histo.data_, BROTLI_NUM_COMMAND_SYMBOLS,
                           BROTLI_NUM_COMMAND_SYMBOLS, tree,
                           cmd_depth, cmd_bits,
                           storage_ix, storage);
  BuildAndStoreHuffmanTree(dist_histo.data_, MAX_SIMPLE_DISTANCE_ALPHABET_SIZE,
                           num_distance_symbols, tree,
                           dist_depth, dist_bits,
                           storage_ix, storage);
  BROTLI_FREE(m, tree);
  StoreDataWithHuffmanCodes(input, start_pos, mask, commands,
                            n_commands, lit_depth, lit_bits,
                            cmd_depth, cmd_bits,
                            dist_depth, dist_bits,
                            storage_ix, storage);
  if (is_last) {
    JumpToByteBoundary(storage_ix, storage);
  }
}